

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall
re2::Regexp::ParseState::ParseCCRange
          (ParseState *this,StringPiece *s,RuneRange *rr,StringPiece *whole_class,
          RegexpStatus *status)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  pcVar2 = s->ptr_;
  bVar4 = ParseCCCharacter(this,s,&rr->lo,whole_class,status);
  if (bVar4) {
    if (((s->length_ < 2) || (pcVar3 = s->ptr_, *pcVar3 != '-')) || (pcVar3[1] == ']')) {
      rr->hi = rr->lo;
      return true;
    }
    s->ptr_ = pcVar3 + 1;
    s->length_ = s->length_ + -1;
    bVar4 = ParseCCCharacter(this,s,&rr->hi,whole_class,status);
    if (bVar4) {
      if (rr->lo <= rr->hi) {
        return true;
      }
      status->code_ = kRegexpBadCharRange;
      iVar1 = *(int *)&s->ptr_;
      (status->error_arg_).ptr_ = pcVar2;
      (status->error_arg_).length_ = iVar1 - (int)pcVar2;
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParseCCRange(StringPiece* s, RuneRange* rr,
                                      const StringPiece& whole_class,
                                      RegexpStatus* status) {
  StringPiece os = *s;
  if (!ParseCCCharacter(s, &rr->lo, whole_class, status))
    return false;
  // [a-] means (a|-), so check for final ].
  if (s->size() >= 2 && (*s)[0] == '-' && (*s)[1] != ']') {
    s->remove_prefix(1);  // '-'
    if (!ParseCCCharacter(s, &rr->hi, whole_class, status))
      return false;
    if (rr->hi < rr->lo) {
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(
          StringPiece(os.data(), static_cast<int>(s->data() - os.data())));
      return false;
    }
  } else {
    rr->hi = rr->lo;
  }
  return true;
}